

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

TokenStream * __thiscall Lexer::lex(TokenStream *__return_storage_ptr__,Lexer *this)

{
  int iVar1;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined1 local_18 [8];
  
  if (lex()::tokenMap == '\0') {
    iVar1 = __cxa_guard_acquire(&lex()::tokenMap);
    if (iVar1 != 0) {
      local_28 = 0x60000002b;
      uStack_20 = 0x70000002d;
      local_38 = 0x40000005b;
      uStack_30 = 0x50000005d;
      local_48 = 0x20000003c;
      uStack_40 = 0x30000003e;
      local_58 = 0x2e;
      uStack_54 = 0;
      uStack_50 = 0x2c;
      uStack_4c = 1;
      std::
      _Hashtable<char,std::pair<char_const,TokenKind>,std::allocator<std::pair<char_const,TokenKind>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_Hashtable<std::pair<char_const,TokenKind>const*>
                ((_Hashtable<char,std::pair<char_const,TokenKind>,std::allocator<std::pair<char_const,TokenKind>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&lex::tokenMap,&local_58,local_18,0,&local_59,&local_5a,&local_5b);
      __cxa_atexit(std::
                   unordered_map<char,_TokenKind,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenKind>_>_>
                   ::~unordered_map,&lex::tokenMap,&__dso_handle);
      __cxa_guard_release(&lex()::tokenMap);
    }
  }
  (__return_storage_ptr__->supplier)._M_invoker =
       std::
       _Function_handler<Token_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/zsr2531[P]bfc/lexer.cpp:43:24)>
       ::_M_invoke;
  *(Lexer **)&(__return_storage_ptr__->supplier).super__Function_base._M_functor = this;
  *(undefined8 *)((long)&(__return_storage_ptr__->supplier).super__Function_base._M_functor + 8) = 0
  ;
  (__return_storage_ptr__->supplier).super__Function_base._M_manager =
       std::
       _Function_handler<Token_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/zsr2531[P]bfc/lexer.cpp:43:24)>
       ::_M_manager;
  (__return_storage_ptr__->stash).super__Optional_base<Token,_true,_true>._M_payload.
  super__Optional_payload_base<Token>._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

auto Lexer::lex() -> TokenStream {
    static std::unordered_map<char, TokenKind> tokenMap = {
        { '.', TokenKind::Dot },
        { ',', TokenKind::Comma },
        { '<', TokenKind::LeftAngledBracket },
        { '>', TokenKind::RightAngledBracket },
        { '[', TokenKind::LeftBracket },
        { ']', TokenKind::RightBracket },
        { '+', TokenKind::Plus },
        { '-', TokenKind::Minus }
    };

    return TokenStream([&]() {
        char character;
        TextSpan span = TextSpan(0, 0);
        TokenKind type;

        do {
            character = supply();
            if (character == '\0')
                return Token(TextSpan(position, position), TokenKind::EndOfFile, '\0');

            span = TextSpan(position - 1, position);
            auto search = tokenMap.find(character);
            type = search == tokenMap.end() ? TokenKind::Comment : search->second;
        } while (type == TokenKind::Comment);

        return Token(span, type, character);
    });
}